

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  uint8_t *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  uint32_t uVar4;
  byte bVar5;
  _Bool _Var6;
  uint uVar7;
  upb_MiniTableField *puVar8;
  upb_SubCounts *puVar9;
  upb_MiniTableField *puVar10;
  uint16_t uVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  byte bVar15;
  char *pcVar16;
  ulong uVar17;
  char cVar18;
  byte bVar19;
  byte *ptr_00;
  bool bVar20;
  bool bVar21;
  upb_LayoutItem item;
  upb_LayoutItem item_00;
  upb_MiniTableField *local_68;
  uint local_5c;
  ulong local_58;
  uint32_t skip;
  uint32_t local_4c;
  uint16_t *local_48;
  upb_SubCounts *local_40;
  size_t local_38;
  
  bVar20 = d->table != (upb_MiniTable *)0x0;
  pbVar13 = (byte *)(ptr + len);
  (d->base).end = (char *)pbVar13;
  local_40 = (upb_SubCounts *)&sub_counts->subenum_count;
  uVar12 = 0;
  local_58 = 0;
  local_68 = (upb_MiniTableField *)0x0;
  local_48 = field_count;
  local_38 = field_size;
  do {
    if (pbVar13 <= ptr) {
      if (bVar20) {
        d->table->dense_below_dont_copy_me__upb_internal_use_only =
             (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
      }
      return (char *)(byte *)ptr;
    }
    ptr_00 = (byte *)ptr + 1;
    bVar19 = *ptr;
    uVar14 = (ulong)bVar19;
    if ((char)bVar19 < 'J') {
      if ((d->table == (upb_MiniTable *)0x0) && (local_68 != (upb_MiniTableField *)0x0)) {
        return (char *)(byte *)ptr;
      }
      *field_count = *field_count + 1;
      uVar7 = (int)local_58 + 1;
      local_58 = (ulong)uVar7;
      ((upb_MiniTableField *)fields)->number_dont_copy_me__upb_internal_use_only = uVar7;
      cVar18 = (d->platform != kUpb_MiniTablePlatform_32Bit) * '\x02' + '\x01';
      bVar5 = _upb_FromBase92(bVar19);
      if (bVar19 < 0x36) {
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = '\x02';
        ((upb_MiniTableField *)fields)->offset_dont_copy_me__upb_internal_use_only = 1;
        if ((bVar5 & 0xfe) != 0x10) {
          if (0x12 < bVar5) goto LAB_00125ae9;
          bVar19 = upb_MiniTable_SetField_kUpb_EncodedToFieldRep[bVar5] << 6 | 2;
          ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar19;
          goto LAB_001259d7;
        }
        bVar19 = cVar18 * '@' | 2;
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar19;
        bVar15 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar5];
      }
      else {
        bVar5 = bVar5 - 0x14;
        bVar19 = cVar18 * '@' + 1;
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar19;
        ((upb_MiniTableField *)fields)->offset_dont_copy_me__upb_internal_use_only = 0;
        if (0x12 < bVar5) {
LAB_00125ae9:
          uVar14 = (ulong)(uint)(int)(char)bVar5;
          pcVar16 = "Invalid field type: %d";
LAB_00125b5e:
          upb_MdDecoder_ErrorJmp(&d->base,pcVar16,uVar14);
        }
LAB_001259d7:
        bVar15 = 5;
        if (bVar5 == 0xc) {
LAB_001259e3:
          bVar19 = bVar19 | 0x10;
          ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar19;
        }
        else if (bVar5 == 0xf) {
          bVar15 = 0xc;
          if ((uVar12 & 1) == 0) goto LAB_001259e3;
          bVar15 = 9;
        }
        else {
          bVar15 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar5];
        }
      }
      ((upb_MiniTableField *)fields)->descriptortype_dont_copy_me__upb_internal_use_only = bVar15;
      _Var6 = upb_MtDecoder_FieldIsPackable((upb_MiniTableField *)fields);
      if ((uVar12 & 2) != 0 && _Var6) {
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar19 | 4;
      }
      puVar9 = sub_counts;
      if (((bVar15 & 0xfe) == 10) || (uVar11 = 0xffff, puVar9 = local_40, bVar15 == 0xe)) {
        uVar11 = puVar9->submsg_count;
        puVar9->submsg_count = uVar11 + 1;
      }
      ((upb_MiniTableField *)fields)->submsg_index_dont_copy_me__upb_internal_use_only = uVar11;
      puVar10 = (upb_MiniTableField *)
                ((long)&((upb_MiniTableField *)fields)->number_dont_copy_me__upb_internal_use_only +
                local_38);
      local_68 = (upb_MiniTableField *)fields;
      ptr = (char *)ptr_00;
    }
    else {
      puVar10 = (upb_MiniTableField *)fields;
      if ((byte)(bVar19 + 0xb4) < 0x10) {
        ptr = upb_MdDecoder_DecodeBase92Varint(&d->base,(char *)ptr_00,bVar19,'L','[',&local_5c);
        uVar7 = local_5c;
        if (local_68 == (upb_MiniTableField *)0x0) {
          uVar12 = local_5c;
          if (d->table == (upb_MiniTable *)0x0) {
            pcVar16 = "Extensions cannot have message modifiers";
LAB_00125b29:
            upb_MdDecoder_ErrorJmp(&d->base,pcVar16);
          }
        }
        else {
          if ((local_5c & 1) != 0) {
            _Var6 = upb_MtDecoder_FieldIsPackable(local_68);
            if (!_Var6) {
              uVar14 = (ulong)local_68->number_dont_copy_me__upb_internal_use_only;
              pcVar16 = "Cannot flip packed on unpackable field %u";
              goto LAB_00125b5e;
            }
            local_68->mode_dont_copy_me__upb_internal_use_only =
                 local_68->mode_dont_copy_me__upb_internal_use_only ^ 4;
          }
          if ((uVar7 & 8) != 0) {
            if ((local_68->descriptortype_dont_copy_me__upb_internal_use_only != '\f') ||
               ((local_68->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0)) {
              upb_MdDecoder_ErrorJmp
                        (&d->base,"Cannot flip ValidateUtf8 on field %u, type=%d, mode=%d",
                         (ulong)local_68->number_dont_copy_me__upb_internal_use_only);
            }
            local_68->descriptortype_dont_copy_me__upb_internal_use_only = '\t';
            local_68->mode_dont_copy_me__upb_internal_use_only =
                 local_68->mode_dont_copy_me__upb_internal_use_only & 0xef;
          }
          if ((uVar7 & 6) != 0) {
            if (local_68->offset_dont_copy_me__upb_internal_use_only != 1) {
              uVar14 = (ulong)local_68->number_dont_copy_me__upb_internal_use_only;
              pcVar16 = "Invalid modifier(s) for repeated field %u";
              goto LAB_00125b5e;
            }
            if ((uVar7 & 6) == 6) {
              uVar14 = (ulong)local_68->number_dont_copy_me__upb_internal_use_only;
              pcVar16 = "Field %u cannot be both singular and required";
              goto LAB_00125b5e;
            }
            if ((uVar7 & 4) != 0) {
              if ((local_68->descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) == 10) {
                uVar14 = (ulong)local_68->number_dont_copy_me__upb_internal_use_only;
                pcVar16 = "Field %u cannot be a singular submessage";
                goto LAB_00125b5e;
              }
              local_68->offset_dont_copy_me__upb_internal_use_only = 0;
            }
            if ((uVar7 & 2) != 0) {
              local_68->offset_dont_copy_me__upb_internal_use_only = 2;
            }
          }
        }
        if ((uVar12 & 4) != 0) {
          puVar1 = &d->table->ext_dont_copy_me__upb_internal_use_only;
          *puVar1 = *puVar1 | 1;
        }
      }
      else if (bVar19 == 0x5e) {
        if (d->table == (upb_MiniTable *)0x0) {
          pcVar16 = "Extensions cannot have oneofs.";
          goto LAB_00125b29;
        }
        uVar17 = 0;
        uVar14 = 0xffff;
        while( true ) {
          item.type = (upb_LayoutItemType)pbVar13;
          if (pbVar13 <= ptr_00) break;
          bVar19 = *ptr_00;
          ptr_00 = ptr_00 + 1;
          if (bVar19 != 0x7c) {
            if (bVar19 != 0x7e) {
              ptr_00 = (byte *)upb_MdDecoder_DecodeBase92Varint
                                         (&d->base,(char *)ptr_00,bVar19,' ','b',&local_4c);
              uVar4 = local_4c;
              puVar8 = upb_MiniTable_FindFieldByNumber(d->table,local_4c);
              if (puVar8 == (upb_MiniTableField *)0x0) {
                pcVar16 = "Couldn\'t add field number %u to oneof, no such field number.";
              }
              else {
                if (puVar8->offset_dont_copy_me__upb_internal_use_only == 1) {
                  bVar19 = puVar8->mode_dont_copy_me__upb_internal_use_only >> 6;
                  uVar7 = (uint)bVar19;
                  bVar21 = d->platform == kUpb_MiniTablePlatform_32Bit;
                  puVar2 = &upb_MtDecoder_SizeOfRep_kRepToSize64;
                  if (bVar21) {
                    puVar2 = &upb_MtDecoder_AlignOfRep_kRepToAlign64;
                  }
                  puVar3 = &upb_MtDecoder_SizeOfRep_kRepToSize64;
                  if (bVar21) {
                    puVar3 = &upb_MtDecoder_AlignOfRep_kRepToAlign64;
                  }
                  if ((byte)puVar2[bVar19] <= (byte)puVar3[uVar17]) {
                    uVar7 = (uint)uVar17;
                  }
                  puVar8->offset_dont_copy_me__upb_internal_use_only = (uint16_t)uVar14;
                  uVar14 = (ulong)((int)(((long)puVar8 - (long)d->fields) / 0xc) + 3);
                  uVar17 = (ulong)uVar7;
                  goto LAB_00125906;
                }
                pcVar16 = "Cannot add repeated, required, or singular field %u to oneof.";
              }
              uVar14 = (ulong)uVar4;
              goto LAB_00125b5e;
            }
            item._0_8_ = uVar14 & 0xffff | uVar17 << 0x20;
            upb_MtDecoder_PushOneof(d,item);
            uVar14 = 0xffff;
          }
LAB_00125906:
          pbVar13 = (byte *)(d->base).end;
        }
        item_00._0_8_ = uVar14 & 0xffff | uVar17 << 0x20;
        item_00.type = item.type;
        upb_MtDecoder_PushOneof(d,item_00);
        field_count = local_48;
        ptr = (char *)ptr_00;
      }
      else {
        if (0x1f < (byte)(bVar19 + 0xa1)) {
          pcVar16 = "Invalid char: %c";
          goto LAB_00125b5e;
        }
        if (bVar20) {
          d->table->dense_below_dont_copy_me__upb_internal_use_only =
               (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
          bVar20 = false;
        }
        ptr = upb_MdDecoder_DecodeBase92Varint(&d->base,(char *)ptr_00,bVar19,'_','~',&skip);
        local_58 = (ulong)(((int)local_58 + skip) - 1);
      }
    }
    pbVar13 = (byte *)(d->base).end;
    fields = puVar10;
  } while( true );
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}